

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt.cc
# Opt level: O0

void __thiscall re2c::Opt::reset_mapCodeName(Opt *this)

{
  opt_t *poVar1;
  Opt *this_local;
  
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->cond_get,(string *)(baseopt + 0x48));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->cond_set,(string *)(baseopt + 0x70));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->fill,(string *)(baseopt + 0x4c0));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->state_get,(string *)(baseopt + 0x1a0));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->state_set,(string *)(baseopt + 0x1c8));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yybackup,(string *)(baseopt + 0x3b0));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yybackupctx,(string *)(baseopt + 0x3d0));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yycondtype,(string *)(baseopt + 0x28));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yyctxmarker,(string *)(baseopt + 0x330));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yyctype,(string *)(baseopt + 0x478));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yycursor,(string *)(baseopt + 0x2f0));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yydebug,(string *)(baseopt + 0x458));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yylessthan,(string *)(baseopt + 0x430));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yylimit,(string *)(baseopt + 0x350));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yymarker,(string *)(baseopt + 0x310));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yypeek,(string *)(baseopt + 0x370));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yyrestore,(string *)(baseopt + 0x3f0));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yyrestorectx,(string *)(baseopt + 0x410));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yyskip,(string *)(baseopt + 0x390));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yyfilllabel,(string *)(baseopt + 0x210));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yynext,(string *)(baseopt + 0x230));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yyaccept,(string *)(baseopt + 0x250));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yybm,(string *)(baseopt + 0x278));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yych,(string *)(baseopt + 0x498));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yyctable,(string *)(baseopt + 0xb8));
  poVar1 = useropt_t::operator->(&this->useropt);
  std::__cxx11::string::operator=((string *)&poVar1->yytarget,(string *)(baseopt + 0x2a0));
  return;
}

Assistant:

void Opt::reset_mapCodeName ()
{
	// historically arranged set of names
	// no actual reason why these particular options should be reset
	useropt->cond_get = Opt::baseopt.cond_get;
	useropt->cond_set = Opt::baseopt.cond_set;
	useropt->fill = Opt::baseopt.fill;
	useropt->state_get = Opt::baseopt.state_get;
	useropt->state_set = Opt::baseopt.state_set;
	useropt->yybackup = Opt::baseopt.yybackup;
	useropt->yybackupctx = Opt::baseopt.yybackupctx;
	useropt->yycondtype = Opt::baseopt.yycondtype;
	useropt->yyctxmarker = Opt::baseopt.yyctxmarker;
	useropt->yyctype = Opt::baseopt.yyctype;
	useropt->yycursor = Opt::baseopt.yycursor;
	useropt->yydebug = Opt::baseopt.yydebug;
	useropt->yylessthan = Opt::baseopt.yylessthan;
	useropt->yylimit = Opt::baseopt.yylimit;
	useropt->yymarker = Opt::baseopt.yymarker;
	useropt->yypeek = Opt::baseopt.yypeek;
	useropt->yyrestore = Opt::baseopt.yyrestore;
	useropt->yyrestorectx = Opt::baseopt.yyrestorectx;
	useropt->yyskip = Opt::baseopt.yyskip;
	useropt->yyfilllabel = Opt::baseopt.yyfilllabel;
	useropt->yynext = Opt::baseopt.yynext;
	useropt->yyaccept = Opt::baseopt.yyaccept;
	useropt->yybm = Opt::baseopt.yybm;
	useropt->yych = Opt::baseopt.yych;
	useropt->yyctable = Opt::baseopt.yyctable;
	useropt->yytarget = Opt::baseopt.yytarget;
}